

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall google::protobuf::RepeatedField<double>::Clear(RepeatedField<double> *this)

{
  bool is_soo_00;
  int iVar1;
  double *begin;
  double *elem;
  bool is_soo;
  RepeatedField<double> *this_local;
  
  is_soo_00 = RepeatedField<double>::is_soo(this);
  begin = unsafe_elements(this,is_soo_00);
  iVar1 = size(this,is_soo_00);
  Destroy(begin,begin + iVar1);
  ExchangeCurrentSize(this,is_soo_00,0);
  return;
}

Assistant:

inline void RepeatedField<Element>::Clear() {
  const bool is_soo = this->is_soo();
  Element* elem = unsafe_elements(is_soo);
  Destroy(elem, elem + size(is_soo));
  ExchangeCurrentSize(is_soo, 0);
}